

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall ON_OBSOLETE_V5_DimExtra::CopyFrom(ON_OBSOLETE_V5_DimExtra *this,ON_Object *src)

{
  ON_OBSOLETE_V5_DimExtra *pOVar1;
  ON_OBSOLETE_V5_DimExtra *s;
  ON_Object *src_local;
  ON_OBSOLETE_V5_DimExtra *this_local;
  
  pOVar1 = Cast(src);
  if ((this == (ON_OBSOLETE_V5_DimExtra *)0x0) || (pOVar1 == (ON_OBSOLETE_V5_DimExtra *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    operator=(this,pOVar1);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

ON_OBSOLETE_V5_DimExtra::ON_OBSOLETE_V5_DimExtra()
{
  m_userdata_uuid = ON_CLASS_ID(ON_OBSOLETE_V5_DimExtra);
  m_application_uuid = ON_opennurbs5_id; // opennurbs.dll reads/writes this userdata
                                         // The id must be the version 5 id because
                                         // V6 SaveAs V5 needs to work, but SaveAs
                                         // V4 should not write this userdata.
  m_userdata_copycount = 1;
  SetDefaults();
}